

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageStore.cpp
# Opt level: O1

void __thiscall
FIX::MemoryStore::get
          (MemoryStore *this,SEQNUM begin,SEQNUM end,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *messages)

{
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_header *p_Var3;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(messages,(messages->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
  p_Var3 = &(this->m_messages)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (this->m_messages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &p_Var3->_M_header;
  for (; p_Var2 != (_Rb_tree_node_base *)0x0;
      p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) < begin]) {
    if (*(ulong *)(p_Var2 + 1) >= begin) {
      p_Var1 = p_Var2;
    }
  }
  p_Var2 = &p_Var3->_M_header;
  if (((_Rb_tree_header *)p_Var1 != p_Var3) && (p_Var2 = p_Var1, begin < *(ulong *)(p_Var1 + 1))) {
    p_Var2 = &p_Var3->_M_header;
  }
  for (; ((_Rb_tree_header *)p_Var2 != p_Var3 && (*(ulong *)(p_Var2 + 1) <= end));
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(messages,(value_type *)&p_Var2[1]._M_parent);
  }
  return;
}

Assistant:

EXCEPT(IOException) {
  messages.clear();
  Messages::const_iterator find = m_messages.find(begin);
  for (; find != m_messages.end() && find->first <= end; ++find) {
    messages.push_back(find->second);
  }
}